

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shared_ptr.cpp
# Opt level: O3

int main(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  _Atomic_word *p_Var1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *peVar5;
  int iVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  element_type *peVar9;
  foo *__p;
  long lVar10;
  bee *__p_00;
  counted *pcVar11;
  undefined8 uVar12;
  __weak_count<(__gnu_cxx::_Lock_policy)2> this_00;
  element_type *peVar13;
  element_type *peVar14;
  bool bVar15;
  shared_ptr<int> p;
  ostringstream oss;
  shared_ptr<foo> f;
  weak_ptr<int> wp;
  shared_ptr<bar> b;
  shared_ptr<bee> bee1;
  shared_ptr<bee> bee2;
  string local_260 [36];
  undefined4 local_23c;
  __shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2> local_238;
  int *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_220;
  ostringstream local_218 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  element_type *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_98;
  __shared_ptr<foo,_(__gnu_cxx::_Lock_policy)2> local_90;
  __weak_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_80;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __weak_ptr<bee,_(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  __weak_ptr<bee,_(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  runtime_error local_40 [16];
  
  local_228 = (int *)operator_new(4);
  *local_228 = 10;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&_Stack_220,local_228);
  _Var3._M_pi = _Stack_220._M_pi;
  if (_Stack_220._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (*local_228 == 10) {
LAB_00104fd2:
      std::__cxx11::ostringstream::ostringstream(local_218);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x49);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," p2.use_count() == 2",0x14);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,local_260);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
LAB_0010508a:
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," *p2==10",8);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (_Stack_220._M_pi)->_M_use_count = (_Stack_220._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (_Stack_220._M_pi)->_M_use_count = (_Stack_220._M_pi)->_M_use_count + 1;
  }
  if (*local_228 != 10) goto LAB_0010508a;
  if ((_Stack_220._M_pi)->_M_use_count != 2) goto LAB_00104fd2;
  *local_228 = 0x14;
  if (*local_228 != 0x14) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x4b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," *p==20",7);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_80._M_ptr = local_228;
  local_80._M_refcount._M_pi = _Stack_220._M_pi;
  if (_Stack_220._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00104cd9:
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x4d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," p.use_count() == 2",0x13);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (_Stack_220._M_pi)->_M_weak_count = (_Stack_220._M_pi)->_M_weak_count + 1;
    UNLOCK();
    if (_Stack_220._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00104cd9;
  }
  else {
    (_Stack_220._M_pi)->_M_weak_count = (_Stack_220._M_pi)->_M_weak_count + 1;
  }
  if ((_Stack_220._M_pi)->_M_use_count != 2) goto LAB_00104cd9;
  if (_Stack_220._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00104c1a:
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x4f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," p3",3);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar6 = (_Stack_220._M_pi)->_M_use_count;
  do {
    if (iVar6 == 0) goto LAB_00104c1a;
    LOCK();
    iVar2 = (_Stack_220._M_pi)->_M_use_count;
    bVar15 = iVar6 == iVar2;
    if (bVar15) {
      (_Stack_220._M_pi)->_M_use_count = iVar6 + 1;
      iVar2 = iVar6;
    }
    iVar6 = iVar2;
    UNLOCK();
  } while (!bVar15);
  if (((_Stack_220._M_pi)->_M_use_count == 0) || (local_228 == (int *)0x0)) goto LAB_00104c1a;
  if ((_Stack_220._M_pi)->_M_use_count != 3) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," p3.use_count() == 3",0x14);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*local_228 != 0x14) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x51);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," *p2==20",8);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((_Stack_220._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((_Stack_220._M_pi)->_M_use_count == 0)) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," !wp.expired()",0xe);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_228 == (int *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x53);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," p",2);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_228 = (int *)0x0;
  _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  if (local_228 != (int *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," !p",3);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((_Var3._M_pi)->_M_use_count != 1) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," p3.use_count() == 1",0x14);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  if (local_80._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00104591:
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if ((local_80._M_refcount._M_pi)->_M_use_count != 0) {
      std::__cxx11::ostringstream::ostringstream(local_218);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x5b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," wp.expired()",0xd);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,local_260);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar6 = (local_80._M_refcount._M_pi)->_M_use_count;
    do {
      if (iVar6 == 0) goto LAB_00104591;
      LOCK();
      iVar2 = (local_80._M_refcount._M_pi)->_M_use_count;
      bVar15 = iVar6 == iVar2;
      if (bVar15) {
        (local_80._M_refcount._M_pi)->_M_use_count = iVar6 + 1;
        iVar2 = iVar6;
      }
      iVar6 = iVar2;
      UNLOCK();
    } while (!bVar15);
    this_00._M_pi = local_80._M_refcount._M_pi;
    if (((local_80._M_refcount._M_pi)->_M_use_count != 0) && (local_80._M_ptr != (int *)0x0)) {
      std::__cxx11::ostringstream::ostringstream(local_218);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," !p4",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,local_260);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)local_218,&local_80);
  std::runtime_error::runtime_error(local_40,"Should not get there");
  std::runtime_error::~runtime_error(local_40);
  if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
  }
  local_90._M_ptr = (element_type *)operator_new(8);
  (local_90._M_ptr)->_vptr_foo = (_func_int **)&PTR__foo_0010ab08;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<foo*>
            (&local_90._M_refcount,local_90._M_ptr);
  local_70 = (element_type *)operator_new(8);
  ((foo *)&local_70->_vptr_foo)->_vptr_foo = (_func_int **)&PTR__foo_0010ab38;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bar*>(&local_68,(bar *)local_70);
  local_90._M_ptr = local_70;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_90._M_refcount,&local_68);
  peVar14 = local_90._M_ptr;
  if (local_90._M_ptr == (element_type *)0x0) {
    peVar13 = (element_type *)0x0;
  }
  else {
    peVar9 = (element_type *)__dynamic_cast(local_90._M_ptr,&foo::typeinfo,&bar::typeinfo,0);
    peVar5 = local_70;
    peVar13 = (element_type *)0x0;
    if ((peVar9 != (element_type *)0x0) &&
       (peVar13 = peVar9,
       local_90._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_90._M_refcount._M_pi)->_M_use_count = (local_90._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_90._M_refcount._M_pi)->_M_use_count = (local_90._M_refcount._M_pi)->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_refcount._M_pi);
      peVar14 = local_90._M_ptr;
      if (peVar9 != peVar5) goto LAB_001055a9;
      goto LAB_001046c7;
    }
  }
  if (peVar13 != local_70) {
LAB_001055a9:
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x68);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," booster::dynamic_pointer_cast<bar>(f)==b",0x29);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_001046c7:
  peVar13 = local_70;
  if (local_90._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90._M_refcount._M_pi)->_M_use_count = (local_90._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90._M_refcount._M_pi)->_M_use_count = (local_90._M_refcount._M_pi)->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_refcount._M_pi);
  }
  if (peVar14 != peVar13) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x69);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," booster::static_pointer_cast<bar>(f)==b",0x28);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __p = (foo *)operator_new(8);
  __p->_vptr_foo = (_func_int **)&PTR__foo_0010ab08;
  std::__shared_ptr<foo,_(__gnu_cxx::_Lock_policy)2>::reset<foo>(&local_90,__p);
  if ((local_90._M_ptr != (element_type *)0x0) &&
     (lVar10 = __dynamic_cast(local_90._M_ptr,&foo::typeinfo,&bar::typeinfo,0), lVar10 != 0)) {
    if (local_90._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_90._M_refcount._M_pi)->_M_use_count = (local_90._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_90._M_refcount._M_pi)->_M_use_count = (local_90._M_refcount._M_pi)->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_refcount._M_pi);
    }
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," booster::dynamic_pointer_cast<bar>(f)==booster::shared_ptr<bar>()",0x42);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __p_00 = (bee *)operator_new(0x10);
  (__p_00->super_enable_shared_from_this<bee>)._M_weak_this.
  super___weak_ptr<bee,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__p_00->super_enable_shared_from_this<bee>)._M_weak_this.
  super___weak_ptr<bee,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<bee,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<bee,void>
            ((__shared_ptr<bee,(__gnu_cxx::_Lock_policy)2> *)&local_60,__p_00);
  std::__shared_ptr<bee,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<bee,void>
            ((__shared_ptr<bee,(__gnu_cxx::_Lock_policy)2> *)&local_50,local_60);
  if (local_60 != local_50) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," bee1==bee2",0xb);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_238._M_ptr = (element_type *)0x0;
  local_238._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (counted::counter != 0) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x72);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==0",0x14);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar11 = (counted *)operator_new(1);
  counted::counter = 1;
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset<counted>(&local_238,pcVar11);
  _Var3._M_pi = local_238._M_refcount._M_pi;
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==1",0x14);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_238._M_ptr = (element_type *)0x0;
  local_238._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Var3._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi),
     counted::counter != 0)) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x76);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==0",0x14);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar11 = (counted *)operator_new(1);
  counted::counter = 1;
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset<counted>(&local_238,pcVar11);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==1",0x14);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a0 = local_238._M_ptr;
  _Stack_98._M_pi = local_238._M_refcount._M_pi;
  if (local_238._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_238._M_refcount._M_pi)->_M_use_count = (local_238._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (counted::counter != 1) {
        std::__cxx11::ostringstream::ostringstream(local_218);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                   ,0x77);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x7a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==1",0x14);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,local_260);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      (local_238._M_refcount._M_pi)->_M_use_count = (local_238._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pcVar11 = (counted *)operator_new(1);
  counted::counter = 2;
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset<counted>(&local_238,pcVar11);
  if (counted::counter != 2) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==2",0x14);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this = &local_238._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this,this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_98,&_Stack_98);
  if (counted::counter != 2) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==2",0x14);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_238._M_ptr = local_a0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this,&_Stack_98);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x81);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==1",0x14);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a0 = local_238._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_98,this);
  _Var3._M_pi = _Stack_98._M_pi;
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x83);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==1",0x14);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_260);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (_Stack_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_98._M_pi)->_M_weak_count = (_Stack_98._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_98._M_pi)->_M_weak_count = (_Stack_98._M_pi)->_M_weak_count + 1;
    }
    iVar6 = (_Stack_98._M_pi)->_M_use_count;
    do {
      if (iVar6 == 0) goto LAB_00105c2d;
      LOCK();
      iVar2 = (_Stack_98._M_pi)->_M_use_count;
      bVar15 = iVar6 == iVar2;
      if (bVar15) {
        (_Stack_98._M_pi)->_M_use_count = iVar6 + 1;
        iVar2 = iVar6;
      }
      iVar6 = iVar2;
      UNLOCK();
    } while (!bVar15);
    if (((_Stack_98._M_pi)->_M_use_count != 0) && (local_a0 != (element_type *)0x0)) {
      if (counted::counter != 1) {
        std::__cxx11::ostringstream::ostringstream(local_218);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                   ,0x77);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x87);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==1",0x14);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,local_260);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_98._M_pi);
      _Var4._M_pi = _Stack_98._M_pi;
      if (counted::counter != 1) {
        std::__cxx11::ostringstream::ostringstream(local_218);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                   ,0x77);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x89);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==1",0x14);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,local_260);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_a0 = (element_type *)0x0;
      _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi),
         counted::counter != 1)) {
        std::__cxx11::ostringstream::ostringstream(local_218);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                   ,0x77);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x8b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==1",0x14);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,local_260);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      _Var4._M_pi = local_238._M_refcount._M_pi;
      local_238._M_ptr = (element_type *)0x0;
      local_238._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Var4._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi),
         counted::counter != 0)) {
        std::__cxx11::ostringstream::ostringstream(local_218);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                   ,0x77);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x8d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," counted::counter==0",0x14);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,local_260);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar6 = (_Var3._M_pi)->_M_use_count;
      do {
        if (iVar6 == 0) goto LAB_00104ad9;
        LOCK();
        iVar2 = (_Var3._M_pi)->_M_use_count;
        bVar15 = iVar6 == iVar2;
        if (bVar15) {
          (_Var3._M_pi)->_M_use_count = iVar6 + 1;
          iVar2 = iVar6;
        }
        iVar6 = iVar2;
        UNLOCK();
      } while (!bVar15);
      iVar6 = (_Var3._M_pi)->_M_use_count;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      if (iVar6 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_218);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                   ,0x77);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x8e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," !wpcnt.lock()",0xe);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,local_260);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_00104ad9:
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(_Var3._M_pi)->_M_weak_count;
        iVar6 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar6 = (_Var3._M_pi)->_M_weak_count;
        (_Var3._M_pi)->_M_weak_count = iVar6 + -1;
      }
      if (iVar6 == 1) {
        (*(_Var3._M_pi)->_vptr__Sp_counted_base[3])(_Var3._M_pi);
      }
      if (_Stack_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_98._M_pi);
      }
      if (local_238._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_refcount._M_pi);
      }
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
      if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
      }
      if (local_90._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_refcount._M_pi);
      }
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      if (local_80._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_80._M_refcount._M_pi)->_M_weak_count;
          iVar6 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar6 = (local_80._M_refcount._M_pi)->_M_weak_count;
          (local_80._M_refcount._M_pi)->_M_weak_count = iVar6 + -1;
        }
        if (iVar6 == 1) {
          (*(local_80._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
        }
      }
      if (_Stack_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_220._M_pi);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      return 0;
    }
  }
LAB_00105c2d:
  std::__cxx11::ostringstream::ostringstream(local_218);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
             ,0x77);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x86);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," cnt3",5);
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  uVar12 = std::__cxx11::stringbuf::str();
  local_23c = (undefined4)CONCAT71((int7)((ulong)uVar12 >> 8),1);
  std::runtime_error::runtime_error(prVar8,local_260);
  local_23c = 0;
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		booster::shared_ptr<int> p(new int(10));
		booster::shared_ptr<int> p2=p;
		TEST(*p2==10);
		TEST(p2.use_count() == 2);
		*p2=20;
		TEST(*p==20);
		booster::weak_ptr<int> wp=p;
		TEST(p.use_count() == 2);
		booster::shared_ptr<int> p3=wp.lock();
		TEST(p3);
		TEST(p3.use_count() == 3);
		TEST(*p2==20);
		TEST(!wp.expired());
		TEST(p);
		TEST(!!p);
		p.reset();
		p2.reset();
		TEST(!p);
		TEST(p3.use_count() == 1);
		p3.reset();
		TEST(!p3);
		TEST(wp.expired());
		booster::shared_ptr<int> p4=wp.lock();
		TEST(!p4);

		try {
			booster::shared_ptr<int> p4(wp);
			std::runtime_error("Should not get there");
		}
		catch(booster::bad_weak_ptr const &e){}

		booster::shared_ptr<foo> f(new foo);
		booster::shared_ptr<bar> b(new bar);
		f=b;
		TEST(booster::dynamic_pointer_cast<bar>(f)==b);
		TEST(booster::static_pointer_cast<bar>(f)==b);
		f.reset(new foo);
		TEST(booster::dynamic_pointer_cast<bar>(f)==booster::shared_ptr<bar>());

		booster::shared_ptr<bee> bee1(new bee);
		booster::shared_ptr<bee> bee2=bee1->self();
		TEST(bee1==bee2);

		booster::shared_ptr<counted> cnt;
		TEST(counted::counter==0);
		cnt.reset(new counted);
		TEST(counted::counter==1);
		cnt.reset();
		TEST(counted::counter==0);
		cnt.reset(new counted);
		TEST(counted::counter==1);
		booster::shared_ptr<counted> cnt2(cnt);
		TEST(counted::counter==1);
		cnt.reset(new counted);
		TEST(counted::counter==2);
		cnt=cnt;
		cnt2=cnt2;
		TEST(counted::counter==2);
		cnt=cnt2;
		TEST(counted::counter==1);
		cnt2=cnt;
		TEST(counted::counter==1);
		booster::weak_ptr<counted> wpcnt(cnt2);
		booster::shared_ptr<counted> cnt3=wpcnt.lock();
		TEST(cnt3);
		TEST(counted::counter==1);
		cnt3.reset();
		TEST(counted::counter==1);
		cnt2.reset();
		TEST(counted::counter==1);
		cnt.reset();
		TEST(counted::counter==0);
		TEST(!wpcnt.lock());

	}
	catch(std::exception const &e) {
		std::cerr << "Fail:" << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;	
}